

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IImage.h
# Opt level: O0

u32 irr::video::IImage::getBitsPerPixelFromFormat(ECOLOR_FORMAT format)

{
  ECOLOR_FORMAT format_local;
  u32 local_4;
  
  switch(format) {
  case ECF_A1R5G5B5:
    local_4 = 0x10;
    break;
  case ECF_R5G6B5:
    local_4 = 0x10;
    break;
  case ECF_R8G8B8:
    local_4 = 0x18;
    break;
  case ECF_A8R8G8B8:
    local_4 = 0x20;
    break;
  case ECF_R16F:
    local_4 = 0x10;
    break;
  case ECF_G16R16F:
    local_4 = 0x20;
    break;
  case ECF_A16B16G16R16F:
    local_4 = 0x40;
    break;
  case ECF_R32F:
    local_4 = 0x20;
    break;
  case ECF_G32R32F:
    local_4 = 0x40;
    break;
  case ECF_A32B32G32R32F:
    local_4 = 0x80;
    break;
  case ECF_R8:
    local_4 = 8;
    break;
  case ECF_R8G8:
    local_4 = 0x10;
    break;
  case ECF_R16:
    local_4 = 0x10;
    break;
  case ECF_R16G16:
    local_4 = 0x20;
    break;
  case ECF_D16:
    local_4 = 0x10;
    break;
  case ECF_D32:
    local_4 = 0x20;
    break;
  case ECF_D24S8:
    local_4 = 0x20;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static u32 getBitsPerPixelFromFormat(const ECOLOR_FORMAT format)
	{
		switch (format) {
		case ECF_A1R5G5B5:
			return 16;
		case ECF_R5G6B5:
			return 16;
		case ECF_R8G8B8:
			return 24;
		case ECF_A8R8G8B8:
			return 32;
		case ECF_D16:
			return 16;
		case ECF_D32:
			return 32;
		case ECF_D24S8:
			return 32;
		case ECF_R8:
			return 8;
		case ECF_R8G8:
			return 16;
		case ECF_R16:
			return 16;
		case ECF_R16G16:
			return 32;
		case ECF_R16F:
			return 16;
		case ECF_G16R16F:
			return 32;
		case ECF_A16B16G16R16F:
			return 64;
		case ECF_R32F:
			return 32;
		case ECF_G32R32F:
			return 64;
		case ECF_A32B32G32R32F:
			return 128;
		default:
			return 0;
		}
	}